

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O0

void __thiscall maxNodeHeap::insert(maxNodeHeap *this,NodeID node,Gain gain)

{
  mapped_type mVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  pair<int,_int> local_64 [3];
  Data local_4c;
  QElement<maxNodeHeap::Data> local_48;
  int local_30;
  mapped_type local_2c;
  int heap_size;
  int element_index;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_20;
  Gain local_18;
  NodeID local_14;
  Gain gain_local;
  NodeID node_local;
  maxNodeHeap *this_local;
  
  local_18 = gain;
  local_14 = node;
  _gain_local = this;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::find(&this->m_element_index,&local_14);
  _heap_size = (__node_type *)
               std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::end(&this->m_element_index);
  bVar2 = std::__detail::operator==
                    (&local_20,(_Node_iterator_base<std::pair<const_int,_int>,_false> *)&heap_size);
  if (bVar2) {
    sVar3 = std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
            ::size(&this->m_elements);
    local_2c = (mapped_type)sVar3;
    sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                      (&this->m_heap);
    local_30 = (int)sVar3;
    Data::Data(&local_4c,local_14);
    QElement<maxNodeHeap::Data>::QElement(&local_48,local_4c,local_18,local_30);
    std::vector<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>::
    push_back(&this->m_elements,&local_48);
    QElement<maxNodeHeap::Data>::~QElement(&local_48);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(local_64,&local_18,&local_2c);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              (&this->m_heap,local_64);
    mVar1 = local_2c;
    pmVar4 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->m_element_index,&local_14);
    *pmVar4 = mVar1;
    siftUp(this,local_30);
  }
  return;
}

Assistant:

inline void maxNodeHeap::insert(NodeID node, Gain gain) {
        if( m_element_index.find(node) == m_element_index.end() ) {
                int element_index =  m_elements.size();
                int heap_size     =  m_heap.size();

                m_elements.push_back( PQElement( Data(node), gain, heap_size) );
                m_heap.push_back( std::pair< Key, int>(gain, element_index) );
                m_element_index[node] = element_index;
                siftUp( heap_size );
        }
}